

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

void __thiscall NaVector::revert(NaVector *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar6;
  
  uVar3 = (*this->_vptr_NaVector[6])();
  uVar4 = (*this->_vptr_NaVector[6])(this);
  for (uVar6 = 0; uVar3 = uVar3 - 1, uVar4 >> 1 != uVar6; uVar6 = uVar6 + 1) {
    iVar5 = (*this->_vptr_NaVector[7])(this,(ulong)uVar6);
    uVar1 = *(undefined8 *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*this->_vptr_NaVector[7])(this,(ulong)uVar3);
    uVar2 = *(undefined8 *)CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*this->_vptr_NaVector[7])(this,(ulong)uVar6);
    *(undefined8 *)CONCAT44(extraout_var_01,iVar5) = uVar2;
    iVar5 = (*this->_vptr_NaVector[7])(this,(ulong)uVar3);
    *(undefined8 *)CONCAT44(extraout_var_02,iVar5) = uVar1;
  }
  return;
}

Assistant:

void
NaVector::revert ()
{
  NaReal	tmp;
  int		i, N = dim(), N_2 = dim()/2;
  for(i = 0; i < N_2; ++i){
    tmp = fetch(i);
    fetch(i) = fetch(N - 1 - i);
    fetch(N - 1 - i) = tmp;
  }
}